

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GLSL420Pack::TestBase::iterate(TestBase *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *description;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  bVar1 = Utils::isExtensionSupported
                    ((this->super_TestCase).m_context,"GL_ARB_explicit_uniform_location");
  this->m_is_explicit_uniform_location = bVar1;
  bVar1 = Utils::isExtensionSupported
                    ((this->super_TestCase).m_context,"GL_ARB_shading_language_420pack");
  this->m_is_shader_language_420pack = bVar1;
  bVar1 = Utils::isGLVersionAtLeast((Functions *)CONCAT44(extraout_var,iVar2),4,3);
  this->m_is_compute_shader_supported = bVar1;
  bVar1 = test(this);
  if (!bVar1) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,(uint)!bVar1,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TestBase::iterate()
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check extension support and version */
	m_is_explicit_uniform_location = Utils::isExtensionSupported(m_context, "GL_ARB_explicit_uniform_location");
	m_is_shader_language_420pack   = Utils::isExtensionSupported(m_context, "GL_ARB_shading_language_420pack");
	m_is_compute_shader_supported  = Utils::isGLVersionAtLeast(gl, 4, 3);

	/* Execute test */
	bool test_result = test();

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}